

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling.cpp
# Opt level: O2

void Al::internal::profiling::name_thread(native_handle_type handle,string *name)

{
  string name_resized;
  
  std::__cxx11::string::substr((ulong)&name_resized,(ulong)name);
  pthread_setname_np(handle,name_resized._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&name_resized);
  return;
}

Assistant:

void name_thread([[maybe_unused]] std::thread::native_handle_type handle,
                 [[maybe_unused]] std::string name) {
#ifdef AL_HAS_NVPROF
  nvtxNameOsThreadA(handle, name.c_str());
#endif
#ifdef _GNU_SOURCE
  // Subtract 1 to account for the terminating null.
  std::string name_resized = name.substr(0, AL_MAX_THREAD_NAME_LEN - 1);
  pthread_setname_np(handle, name_resized.c_str());
#endif
}